

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformation_t *
opengv::absolute_pose::gpnp
          (transformation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,Indices *indices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  transformation_t *ptVar25;
  int iVar26;
  PointerType ptr;
  undefined8 *puVar27;
  Index size;
  double *pdVar28;
  long lVar29;
  long *plVar30;
  ulong uVar31;
  double *pdVar32;
  ulong uVar33;
  size_t sVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  point_t c0;
  points_t c;
  MatrixXd p;
  MatrixXd D;
  MatrixXd weights;
  MatrixXd A;
  MatrixXd V;
  MatrixXd invD;
  MatrixXd b;
  MatrixXd pinvA;
  Matrix<double,_12,_1,_0,_12,_1> a;
  rotation_t camRotation;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD2;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  Matrix<double,_3,_1,_0,_3,_1> local_b30;
  points_t local_b10;
  undefined1 local_af0 [16];
  Index local_ae0;
  DenseStorage<double,__1,__1,__1,_0> local_ad0;
  DenseStorage<double,__1,__1,__1,_0> local_ab0;
  undefined1 local_a90 [16];
  double local_a78;
  transformation_t *local_a70;
  MatrixType local_a68;
  DenseStorage<double,__1,__1,__1,_0> local_a50;
  long *local_a38;
  long local_a30;
  Matrix<double,__1,__1,_0,__1,__1> local_a20;
  Matrix<double,__1,__1,_0,__1,__1> local_a08;
  double local_9f0;
  double dStack_9e8;
  double local_9e0;
  double dStack_9d8;
  undefined1 local_9d0 [16];
  double local_9c0;
  double dStack_9b8;
  double local_9b0;
  double dStack_9a8;
  Matrix<double,_12,_1,_0,_12,_1> local_9a0;
  Matrix<double,_12,_12,_0,_12,_12> local_940;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_4b8;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_298;
  
  auVar41 = in_ZMM2._0_16_;
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = ZEXT816(0);
  local_a70 = __return_storage_ptr__;
  if (indices->_numberCorrespondences == 0) {
    local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
    _0_16_ = ZEXT816(0) << 0x40;
    uVar39 = 0;
  }
  else {
    lVar36 = 0;
    uVar38 = 0;
    do {
      if (indices->_useIndices == false) {
        iVar37 = (int)uVar38;
      }
      else {
        iVar37 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar36 >> 0x1e));
      }
      (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_940,adapter,(long)iVar37);
      auVar41 = in_ZMM2._0_16_;
      uVar38 = uVar38 + 1;
      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
            m_data.array[0];
      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
            m_data.array[1];
      lVar36 = lVar36 + 0x100000000;
      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
            m_data.array[2];
      uVar39 = indices->_numberCorrespondences;
    } while (uVar38 < uVar39);
  }
  auVar41 = vcvtusi2sd_avx512f(auVar41,uVar39);
  local_ae0 = 0;
  dVar49 = auVar41._0_8_;
  auVar41._8_8_ = dVar49;
  auVar41._0_8_ = dVar49;
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] / dVar49;
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = vdivpd_avx((undefined1  [16])
                      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array._0_16_,auVar41);
  local_af0 = ZEXT816(0);
  if ((uVar39 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar39),0) < 3)) {
    puVar27 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar27 = operator_delete;
    __cxa_throw(puVar27,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_af0,uVar39 * 3,3,uVar39);
  if (indices->_numberCorrespondences != 0) {
    lVar36 = 0;
    uVar39 = 0;
    do {
      iVar37 = (int)uVar39;
      if (indices->_useIndices == true) {
        iVar37 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar37];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_940,adapter,(long)iVar37);
      uVar38 = local_af0._8_8_;
      if ((((ulong)(local_af0._0_8_ + local_af0._8_8_ * uVar39 * 8) & 7) == 0) &&
         (uVar38 = (ulong)(-((uint)((ulong)(local_af0._0_8_ + local_af0._8_8_ * uVar39 * 8) >> 3) &
                            0x1fffffff) & 7), (long)local_af0._8_8_ <= (long)uVar38)) {
        uVar38 = local_af0._8_8_;
      }
      uVar33 = local_af0._8_8_ - uVar38;
      uVar31 = uVar33 + 7;
      if (-1 < (long)uVar33) {
        uVar31 = uVar33;
      }
      if (0 < (long)uVar38) {
        uVar35 = 0;
        do {
          *(double *)(local_af0._0_8_ + uVar35 * 8 + local_af0._8_8_ * lVar36) =
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[uVar35] -
               local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar35];
          uVar35 = uVar35 + 1;
        } while (uVar38 != uVar35);
      }
      uVar31 = (uVar31 & 0xfffffffffffffff8) + uVar38;
      if (7 < (long)uVar33) {
        do {
          auVar42 = vsubpd_avx512f(*(undefined1 (*) [64])
                                    (local_940.
                                     super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>
                                     .m_storage.m_data.array + uVar38),
                                   *(undefined1 (*) [64])
                                    (local_b30.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array + uVar38));
          *(undefined1 (*) [64])(local_af0._0_8_ + uVar38 * 8 + local_af0._8_8_ * lVar36) = auVar42;
          uVar38 = uVar38 + 8;
        } while ((long)uVar38 < (long)uVar31);
      }
      if ((long)uVar31 < (long)local_af0._8_8_) {
        do {
          *(double *)(local_af0._0_8_ + uVar31 * 8 + local_af0._8_8_ * lVar36) =
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[uVar31] -
               local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar31];
          uVar31 = uVar31 + 1;
        } while (local_af0._8_8_ != uVar31);
      }
      uVar39 = uVar39 + 1;
      lVar36 = lVar36 + 8;
    } while (uVar39 < indices->_numberCorrespondences);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_298,(MatrixType *)local_af0,0x28);
  local_b10.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b10.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_b10.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_b10,(iterator)0x0,&local_b30);
  auVar9._8_8_ = 0x402e000000000000;
  auVar9._0_8_ = 0x402e000000000000;
  auVar41 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             local_298.
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                             .m_matrixU.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data,auVar9);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = auVar41._0_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = auVar41._8_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = *(double *)
         *(undefined1 (*) [16])
          ((long)local_298.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + 0x10) * 15.0 +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_b10,
               (iterator)
               local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_940);
  }
  else {
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[2];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[0];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[1];
    local_b10.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b10.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  auVar12._8_8_ = 0x402e000000000000;
  auVar12._0_8_ = 0x402e000000000000;
  auVar41 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             ((undefined1 *)
                              local_298.
                              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                              .m_matrixU.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data +
                             local_298.
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                             .m_matrixU.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows * 8),auVar12);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = auVar41._0_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = auVar41._8_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = *(double *)
         (*(undefined1 (*) [16])
           ((long)local_298.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + 0x10) +
         local_298.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
         m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         * 8) * 15.0 +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_b10,
               (iterator)
               local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_940);
  }
  else {
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[2];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[0];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[1];
    local_b10.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b10.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  auVar13._8_8_ = 0x402e000000000000;
  auVar13._0_8_ = 0x402e000000000000;
  auVar41 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             ((long)local_298.
                                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                                    .m_matrixU.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data +
                             local_298.
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                             .m_matrixU.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows * 0x10),auVar13);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = auVar41._0_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = auVar41._8_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = *(double *)
         *(undefined1 (*) [16])
          ((long)local_298.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
          (local_298.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows + 1) * 0x10) * 15.0 +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_b10,
               (iterator)
               local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_940);
  }
  else {
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[2];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[0];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[1];
    local_b10.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b10.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  sVar3 = indices->_numberCorrespondences;
  local_9e0 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  dStack_9d8 = local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
  local_a90._0_8_ =
       local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_a90._8_8_ =
       local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_9f0 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  dStack_9e8 = local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_b10.
       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_9d0 = vmovhps_avx(auVar44,local_b10.
                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]);
  local_9b0 = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2];
  dStack_9a8 = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
  local_9c0 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  dStack_9b8 = local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
  local_a78 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ;
  local_ab0.m_cols = 0;
  local_ab0.m_data = (double *)0x0;
  local_ab0.m_rows = 0;
  if ((sVar3 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)sVar3),0) < 4)) {
    puVar27 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar27 = operator_delete;
    __cxa_throw(puVar27,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ab0,sVar3 * 4,4,sVar3);
  sVar3 = indices->_numberCorrespondences;
  if (sVar3 != 0) {
    auVar19._8_8_ = dStack_9d8;
    auVar19._0_8_ = local_9e0;
    auVar18._8_8_ = dStack_9e8;
    auVar18._0_8_ = local_9f0;
    auVar21._8_8_ = dStack_9a8;
    auVar21._0_8_ = local_9b0;
    pdVar28 = (double *)(local_af0._0_8_ + 0x10);
    auVar41 = vsubpd_avx(auVar19,local_a90);
    auVar9 = vsubpd_avx(auVar18,local_a90);
    dVar49 = auVar41._0_8_;
    dVar5 = auVar41._8_8_;
    dVar43 = auVar9._0_8_;
    dVar6 = auVar9._8_8_;
    auVar41 = vsubpd_avx(local_9d0,auVar21);
    dVar50 = auVar41._0_8_;
    dVar7 = auVar41._8_8_;
    auVar52._0_8_ = dVar49 * dVar49 + dVar5 * dVar5 + dVar50 * dVar50;
    auVar52._8_8_ = dVar43 * dVar43 + dVar6 * dVar6 + dVar7 * dVar7;
    auVar20._8_8_ = dStack_9b8;
    auVar20._0_8_ = local_9c0;
    auVar41 = vsubpd_avx(auVar20,local_a90);
    dVar4 = auVar41._0_8_;
    dVar8 = auVar41._8_8_;
    dVar10 = local_a78 - local_9b0;
    pdVar32 = local_ab0.m_data;
    sVar34 = sVar3;
    do {
      dVar16 = pdVar28[-2];
      dVar17 = pdVar28[-1];
      dVar53 = *pdVar28;
      pdVar28 = pdVar28 + local_af0._8_8_;
      auVar54._0_8_ = dVar53 * dVar50 + dVar16 * dVar49 + dVar17 * dVar5;
      auVar54._8_8_ = dVar53 * dVar7 + dVar16 * dVar43 + dVar17 * dVar6;
      auVar41 = vdivpd_avx(auVar54,auVar52);
      dVar53 = (dVar53 * dVar10 + dVar16 * dVar4 + dVar17 * dVar8) /
               (dVar10 * dVar10 + dVar4 * dVar4 + dVar8 * dVar8);
      *(undefined1 (*) [16])(pdVar32 + 1) = auVar41;
      pdVar32[3] = dVar53;
      *pdVar32 = 1.0 - (dVar53 + auVar41._0_8_ + auVar41._8_8_);
      pdVar32 = pdVar32 + local_ab0.m_rows;
      sVar34 = sVar34 - 1;
    } while (sVar34 != 0);
  }
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(sVar3 * 2);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 5.92878775009496e-323;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a68,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(indices->_numberCorrespondences * 2);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 4.94065645841247e-324;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a20,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_940);
  if (indices->_numberCorrespondences != 0) {
    local_a90._8_8_ = 0x8000000000000000;
    local_a90._0_8_ = 0x8000000000000000;
    lVar36 = 8;
    lVar40 = 0;
    uVar39 = 0;
    do {
      iVar37 = (int)uVar39;
      lVar29 = lVar40 >> 0x1e;
      iVar26 = iVar37;
      if (indices->_useIndices != false) {
        iVar26 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar29);
      }
      (*adapter->_vptr_AbsoluteAdapterBase[4])(&local_4b8,adapter,(long)iVar26);
      iVar26 = iVar37;
      if (indices->_useIndices != false) {
        iVar26 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar29);
      }
      (*adapter->_vptr_AbsoluteAdapterBase[5])(&local_940,adapter,(long)iVar26);
      if (indices->_useIndices != false) {
        iVar37 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar29);
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_9a0,adapter,(long)iVar37);
      auVar22._8_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[1];
      auVar22._0_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[0];
      auVar14._8_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[0];
      auVar14._0_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[0];
      auVar41 = vmulpd_avx512vl(auVar22,auVar14);
      auVar23._8_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[4];
      auVar23._0_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[3];
      auVar15._8_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[1];
      auVar15._0_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[1];
      auVar41 = vfmadd132pd_avx512vl(auVar23,auVar41,auVar15);
      auVar47._8_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[2];
      auVar47._0_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[2];
      lVar29 = local_ab0.m_rows * uVar39;
      uVar39 = uVar39 + 1;
      auVar24._8_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[7];
      auVar24._0_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[6];
      auVar41 = vfmadd231pd_fma(auVar41,auVar47,auVar24);
      dVar49 = local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[2] *
               local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[0] +
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[5] *
               local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[1] +
               local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[2] *
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[8];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data + lVar36 + -8) = dVar49 * local_ab0.m_data[lVar29];
      dVar43 = auVar41._0_8_;
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x10 + -8 + lVar36) = dVar43 * (double)((ulong)local_ab0.m_data[lVar29] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x18 + lVar36 + -8) = dVar49 * local_ab0.m_data[lVar29 + 1];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x28 + lVar36 + -8) =
           dVar43 * (double)((ulong)local_ab0.m_data[lVar29 + 1] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x30 + -8 + lVar36) = dVar49 * local_ab0.m_data[lVar29 + 2];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x40 + -8 + lVar36) =
           dVar43 * (double)((ulong)local_ab0.m_data[lVar29 + 2] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x48 + lVar36 + -8) = dVar49 * local_ab0.m_data[lVar29 + 3];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x58 + -8 + lVar36) =
           dVar43 * (double)((ulong)local_ab0.m_data[lVar29 + 3] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       8 + lVar36) = dVar49 * local_ab0.m_data[lVar29];
      auVar41 = vshufpd_avx(auVar41,auVar41,1);
      dVar50 = auVar41._0_8_;
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x10 + lVar36) = dVar50 * (double)((ulong)local_ab0.m_data[lVar29] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x20 + lVar36) = dVar49 * local_ab0.m_data[lVar29 + 1];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x28 + lVar36) = dVar50 * (double)((ulong)local_ab0.m_data[lVar29 + 1] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x38 + lVar36) = dVar49 * local_ab0.m_data[lVar29 + 2];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x40 + lVar36) = dVar50 * (double)((ulong)local_ab0.m_data[lVar29 + 2] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x50 + lVar36) = dVar49 * local_ab0.m_data[lVar29 + 3];
      lVar40 = lVar40 + 0x100000000;
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x58 + lVar36) = dVar50 * (double)((ulong)local_ab0.m_data[lVar29 + 3] ^ local_a90._0_8_);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_4b8.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
      auVar45._8_8_ = 0;
      auVar45._0_8_ =
           dVar43 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar49;
      auVar41 = vfmsub231sd_fma(auVar45,auVar48,auVar1);
      *(long *)((long)local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data + lVar36 + -8) = auVar41._0_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_4b8.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
      auVar46._8_8_ = 0;
      auVar46._0_8_ =
           dVar50 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
      auVar41 = vfmsub231sd_fma(auVar46,auVar48,auVar2);
      *(long *)((long)local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data + lVar36) = auVar41._0_8_;
      lVar36 = lVar36 + 0x10;
    } while (uVar39 < indices->_numberCorrespondences);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_4b8,&local_a68,0x28);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = 5.92878775009496e-323;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 5.92878775009496e-323;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a38,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_940);
  local_ad0.m_data = (double *)0x0;
  local_ad0.m_rows = 0;
  local_ad0.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_ad0,
             local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,
             local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,1);
  if ((local_ad0.m_rows !=
       local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows) || (lVar36 = 1, local_ad0.m_cols != 1)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_ad0,
               local_4b8.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,
               local_4b8.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,1);
    local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
    m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_ad0.m_rows;
    lVar36 = local_ad0.m_cols;
  }
  uVar38 = lVar36 * local_4b8.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                    m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
  uVar39 = uVar38 + 7;
  if (-1 < (long)uVar38) {
    uVar39 = uVar38;
  }
  uVar39 = uVar39 & 0xfffffffffffffff8;
  if (7 < (long)uVar38) {
    lVar36 = 0;
    do {
      *(undefined1 (*) [64])(local_ad0.m_data + lVar36) =
           *(undefined1 (*) [64])
            (local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data + lVar36);
      lVar36 = lVar36 + 8;
    } while (lVar36 < (long)uVar39);
  }
  if ((long)uVar39 < (long)uVar38) {
    do {
      local_ad0.m_data[uVar39] =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
           .m_data[uVar39];
      uVar39 = uVar39 + 1;
    } while (uVar38 - uVar39 != 0);
  }
  lVar36 = 0;
  plVar30 = local_a38;
  do {
    pdVar32 = local_ad0.m_data + lVar36;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = *pdVar32;
    lVar36 = lVar36 + 1;
    uVar11 = vcmpsd_avx512f(auVar51,ZEXT816(0x3eb0c6f7a0b5ed8d),0xe);
    *plVar30 = (ulong)((byte)uVar11 & 1) * (long)(1.0 / *pdVar32);
    plVar30 = plVar30 + local_a30 + 1;
  } while (lVar36 != 0xc);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_a50,
             (DenseStorage<double,__1,__1,__1,_0> *)
             &local_4b8.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)&local_a50;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = (double)&local_a38;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = (double)&local_4b8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a08,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_940);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,12,1,0,12,1>>(&local_9a0,&local_a08,&local_a20);
  ptVar25 = local_a70;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = *local_a50.m_data;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = local_a50.m_data[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = local_a50.m_data[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [3] = local_a50.m_data[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [4] = local_a50.m_data[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [5] = local_a50.m_data[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [6] = local_a50.m_data[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [7] = local_a50.m_data[7];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [8] = local_a50.m_data[8];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [9] = local_a50.m_data[9];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [10] = local_a50.m_data[10];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xb] = local_a50.m_data[0xb];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xc] = local_a50.m_data[0xc];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xd] = local_a50.m_data[0xd];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xe] = local_a50.m_data[0xe];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xf] = local_a50.m_data[0xf];
  pdVar32 = local_a50.m_data + local_a50.m_rows + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x10] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x11] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x12] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x13] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x14] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x15] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x16] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x17] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 2;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x18] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x19] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1f] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 2 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x20] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x21] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x22] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x23] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x24] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x25] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x26] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x27] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 3 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x28] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x29] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2f] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x30] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x31] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x32] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x33] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x34] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x35] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x36] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x37] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 4 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x38] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x39] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3f] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 5 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x40] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x41] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x42] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x43] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x44] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x45] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x46] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x47] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 6;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x48] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x49] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4f] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 6 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x50] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x51] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x52] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x53] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x54] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x55] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x56] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x57] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 7 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x58] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x59] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5f] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x60] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x61] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x62] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [99] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [100] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x65] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x66] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x67] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 8 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x68] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x69] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6f] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 9 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x70] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x71] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x72] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x73] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x74] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x75] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x76] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x77] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 10;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x78] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x79] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7f] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 10 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x80] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x81] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x82] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x83] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x84] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x85] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x86] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x87] = pdVar32[7];
  pdVar32 = local_a50.m_data + local_a50.m_rows * 0xb + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x88] = *pdVar32;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x89] = pdVar32[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8a] = pdVar32[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8b] = pdVar32[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8c] = pdVar32[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8d] = pdVar32[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8e] = pdVar32[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8f] = pdVar32[7];
  modules::gpnp_main(&local_9a0,&local_940,&local_b10,local_a70);
  if (local_a08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_a50.m_data != (double *)0x0) {
    free((void *)local_a50.m_data[-1]);
  }
  if (local_ad0.m_data != (double *)0x0) {
    free((void *)local_ad0.m_data[-1]);
  }
  if (local_a38 != (long *)0x0) {
    free((void *)local_a38[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_4b8);
  if (local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_ab0.m_data != (double *)0x0) {
    free((void *)local_ab0.m_data[-1]);
  }
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_b10.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_298);
  if ((double *)local_af0._0_8_ != (double *)0x0) {
    free(*(void **)(local_af0._0_8_ + -8));
  }
  return ptVar25;
}

Assistant:

transformation_t gpnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 5 );

  //compute the centroid
  point_t c0 = Eigen::Vector3d::Zero();
  for( size_t i = 0; i < indices.size(); i++ )
    c0 = c0 + adapter.getPoint(indices[i]);
  c0 = c0 / indices.size();

  //compute the point-cloud
  Eigen::MatrixXd p(3,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
    p.col(i) = adapter.getPoint(indices[i]) - c0;

  //compute the moment
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      p,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  //define the control points
  points_t c;
  c.push_back(c0);
  //c.push_back(c0 + SVD.singularValues()[0] * SVD.matrixU().col(0));
  //c.push_back(c0 + SVD.singularValues()[1] * SVD.matrixU().col(1));
  //c.push_back(c0 + SVD.singularValues()[2] * SVD.matrixU().col(2));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(0));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(1));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(2));

  //derive the barycentric frame
  Eigen::Vector3d e1 = c[1]-c0;
  double e1dote1 = e1.dot(e1);
  Eigen::Vector3d e2 = c[2]-c0;
  double e2dote2 = e2.dot(e2);
  Eigen::Vector3d e3 = c[3]-c0;
  double e3dote3 = e3.dot(e3);

  //derive the weighting factors
  Eigen::MatrixXd weights(4,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
  {
    Eigen::Vector3d temp = p.col(i);
    weights(1,i) = temp.dot(e1)/e1dote1;
    weights(2,i) = temp.dot(e2)/e2dote2;
    weights(3,i) = temp.dot(e3)/e3dote3;
    weights(0,i) = 1.0-(weights(1,i)+weights(2,i)+weights(3,i));
  }

  //setup matrix A and vector b
  Eigen::MatrixXd A = Eigen::MatrixXd::Zero(2*indices.size(),12);
  Eigen::MatrixXd b = Eigen::MatrixXd::Zero(2*indices.size(),1);
  for( size_t i = 0; i < indices.size(); i++ )
  {
    translation_t camOffset = adapter.getCamOffset(indices[i]);
    rotation_t camRotation = adapter.getCamRotation(indices[i]);
    //respect the rotation
    bearingVector_t f = camRotation * adapter.getBearingVector(indices[i]);

    A(2*i,0)  =  weights(0,i)*f[2];
    A(2*i,2)  = -weights(0,i)*f[0];
    A(2*i,3)  =  weights(1,i)*f[2];
    A(2*i,5)  = -weights(1,i)*f[0];
    A(2*i,6)  =  weights(2,i)*f[2];
    A(2*i,8)  = -weights(2,i)*f[0];
    A(2*i,9)  =  weights(3,i)*f[2];
    A(2*i,11) = -weights(3,i)*f[0];

    A(2*i+1,1)  =  weights(0,i)*f[2];
    A(2*i+1,2)  = -weights(0,i)*f[1];
    A(2*i+1,4)  =  weights(1,i)*f[2];
    A(2*i+1,5)  = -weights(1,i)*f[1];
    A(2*i+1,7)  =  weights(2,i)*f[2];
    A(2*i+1,8)  = -weights(2,i)*f[1];
    A(2*i+1,10) =  weights(3,i)*f[2];
    A(2*i+1,11) = -weights(3,i)*f[1];

    b(2*i,0)   = f[2]*camOffset[0]-f[0]*camOffset[2];
    b(2*i+1,0) = f[2]*camOffset[1]-f[1]*camOffset[2];
  }

  //computing the SVD
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD2(
      A,
      Eigen::ComputeThinV | Eigen::ComputeThinU );

  //computing the pseudoinverse
  Eigen::MatrixXd invD = Eigen::MatrixXd::Zero(12,12);
  Eigen::MatrixXd D = SVD2.singularValues();
  for( size_t i = 0; i < 12; i++ )
  {
    if( D(i,0) > 1.e-6 )
      invD(i,i) = 1.0/D(i,0);
    else
      invD(i,i) = 0.0;
  }

  //Extract the nullsapce vectors;
  Eigen::MatrixXd V = SVD2.matrixV();

  //computing the nullspace intercept
  Eigen::MatrixXd pinvA = V * invD * SVD2.matrixU().transpose();

  //compute the intercept
  Eigen::Matrix<double,12,1> a = pinvA * b;

  //compute the solution
  transformation_t transformation;
  modules::gpnp_main( a, V, c, transformation );
  return transformation;
}